

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppMemory.h
# Opt level: O0

void __thiscall cppforth::Forth::memAllocate(Forth *this)

{
  ulong __n;
  allocator<unsigned_char> local_39;
  undefined1 local_38 [8];
  VirtualMemorySegment variables;
  Cell start;
  uint size;
  Forth *this_local;
  
  requireDStackDepth(this,1,"ALLOCATE");
  requireDStackAvailable(this,1,"ALLOCATE");
  variables.segment.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = ForthStack<unsigned_int>::getTop(&this->dStack);
  variables.segment.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = this->VirtualMemoryFreeSegment;
  ForthStack<unsigned_int>::push(&this->dStack,0);
  if (this->vmMaxSegmentSize <
      variables.segment.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_) {
    ForthStack<unsigned_int>::setTop(&this->dStack,1,0);
    ForthStack<unsigned_int>::setTop(&this->dStack,0xffffffc5);
  }
  else {
    this->VirtualMemoryFreeSegment =
         this->VirtualMemoryFreeSegment +
         variables.segment.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
         .super__Vector_impl_data._M_end_of_storage._4_4_;
    local_38._0_4_ =
         (Cell)variables.segment.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_38._4_4_ = this->VirtualMemoryFreeSegment;
    __n = (ulong)variables.segment.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    std::allocator<unsigned_char>::allocator(&local_39);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&variables,__n,&local_39);
    std::allocator<unsigned_char>::~allocator(&local_39);
    std::
    vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
    ::push_back(&this->VirtualMemory,(value_type *)local_38);
    ForthStack<unsigned_int>::setTop
              (&this->dStack,1,
               (Cell)variables.segment.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
    VirtualMemorySegment::~VirtualMemorySegment((VirtualMemorySegment *)local_38);
  }
  return;
}

Assistant:

void memAllocate() {
			REQUIRE_DSTACK_DEPTH(1, "ALLOCATE");
			REQUIRE_DSTACK_AVAILABLE(1, "ALLOCATE");
			auto size = dStack.getTop();
			Cell start = VirtualMemoryFreeSegment;
			dStack.push(0);
			try{
				if (size <= vmMaxSegmentSize){
					VirtualMemoryFreeSegment += static_cast<Cell>(size);
					VirtualMemorySegment variables{ start, VirtualMemoryFreeSegment, std::vector<Char>(size) };
					VirtualMemory.push_back(variables);
					dStack.setTop(1,CELL(start));
				}
				else {
					dStack.setTop(1,CELL(0));
					dStack.setTop(CELL(errorAllocate));
				}
			}
			catch (...){
				dStack.setTop(1, CELL(0));
				dStack.setTop(CELL(errorAllocate));
			}
		}